

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  Own<capnp::SchemaLoader::Impl> *this_00;
  Impl *this_01;
  RawSchema *pRVar1;
  EVP_PKEY_CTX *extraout_RAX;
  TryGetResult TVar2;
  Fault local_60;
  Fault f;
  RawSchema *mutableSchema;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> lock;
  LazyLoadCallback *c;
  RawSchema *schema_local;
  InitializerImpl *this_local;
  
  lock.ptr = (Own<capnp::SchemaLoader::Impl> *)
             kj::_::readMaybe<capnp::SchemaLoader::LazyLoadCallback_const>(&this->callback);
  if (lock.ptr != (Own<capnp::SchemaLoader::Impl> *)0x0) {
    (*(code *)(lock.ptr)->disposer->_vptr_Disposer)(lock.ptr,this->loader,*(undefined8 *)ctx);
  }
  if (*(long *)(ctx + 0x40) != 0) {
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)&mutableSchema);
    this_00 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                        ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&mutableSchema);
    this_01 = kj::Own<capnp::SchemaLoader::Impl>::get(this_00);
    TVar2 = SchemaLoader::Impl::tryGet(this_01,*(uint64_t *)ctx);
    pRVar1 = TVar2.schema;
    if (pRVar1 != (RawSchema *)ctx) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                (&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x775,FAILED,"mutableSchema == schema",
                 "\"A schema not belonging to this loader used its initializer.\"",
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    pRVar1->lazyInitializer = (Initializer *)0x0;
    (pRVar1->defaultBrand).lazyInitializer = (Initializer *)0x0;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&mutableSchema);
    ctx = extraout_RAX;
  }
  return (int)ctx;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_MAYBE(c, callback) {
    c->load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}